

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DatatypeValidator::setTypeName(DatatypeValidator *this,XMLCh *typeName)

{
  int iVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  int commaOffset;
  XMLSize_t nameLen;
  XMLCh *typeName_local;
  DatatypeValidator *this_local;
  
  if (this->fTypeName != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fTypeName);
    this->fTypeName = (XMLCh *)0x0;
  }
  if (typeName == (XMLCh *)0x0) {
    this->fTypeLocalName = L"";
    this->fTypeUri = L"";
  }
  else {
    XVar3 = XMLString::stringLen(typeName);
    iVar1 = XMLString::indexOf(typeName,L',');
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(XVar3 + 1) * 2);
    this->fTypeName = (XMLCh *)CONCAT44(extraout_var,iVar2);
    XMLString::moveChars(this->fTypeName,typeName,XVar3 + 1);
    if (iVar1 == -1) {
      this->fTypeUri = (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      this->fTypeLocalName = this->fTypeName;
    }
    else {
      this->fTypeUri = this->fTypeName;
      this->fTypeLocalName = this->fTypeName + (iVar1 + 1);
      this->fTypeName[iVar1] = L'\0';
    }
  }
  return;
}

Assistant:

void DatatypeValidator::setTypeName(const XMLCh* const typeName)
{
    if (fTypeName)
    {
        fMemoryManager->deallocate(fTypeName);
        fTypeName = 0;
    }

    if (typeName)
    {
        XMLSize_t nameLen = XMLString::stringLen(typeName);
        int commaOffset = XMLString::indexOf(typeName, chComma);

        fTypeName = (XMLCh*) fMemoryManager->allocate
        (
            (nameLen + 1) * sizeof(XMLCh)
        );
	    XMLString::moveChars(fTypeName, typeName, nameLen+1);

        if ( commaOffset == -1) {
            fTypeUri = SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
            fTypeLocalName = fTypeName;
        }
        else {
            fTypeUri = fTypeName;
            fTypeLocalName = &fTypeName[commaOffset+1];
            fTypeName[commaOffset] = chNull;
        }
    }
    else
    {
        fTypeUri = fTypeLocalName = XMLUni::fgZeroLenString;
    }
}